

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive.h
# Opt level: O2

bool __thiscall
acto::intrusive::queue<acto::core::object_t,_acto::intrusive::spin_lock>::empty
          (queue<acto::core::object_t,_acto::intrusive::spin_lock> *this)

{
  object_t *poVar1;
  
  spin_lock::lock(&this->mutex_);
  poVar1 = this->tail_;
  spin_lock::unlock(&this->mutex_);
  return poVar1 == (object_t *)0x0;
}

Assistant:

bool empty() const {
    std::lock_guard g(mutex_);

    return tail_ == nullptr;
  }